

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O0

periodic_task_handle_conflict
libcmepoll_LTX_add_periodic
          (CMtrans_services_conflict svc,select_data_ptr *sdp,int interval_sec,int interval_usec,
          select_list_func func,void *arg1,void *arg2)

{
  int iVar1;
  periodic_task_handle_conflict p_Var2;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  long in_RDI;
  CMtrans_services_conflict in_R8;
  select_data_ptr *in_R9;
  periodic_task_handle_conflict handle;
  select_data_ptr sd;
  long lVar3;
  
  lVar3 = *in_RSI;
  p_Var2 = (periodic_task_handle_conflict)malloc(0x40);
  if (lVar3 == 0) {
    init_select_data(in_R8,in_R9,(CManager)0x0);
    lVar3 = *in_RSI;
  }
  if ((*(long *)(lVar3 + 0x30) != 0) &&
     (iVar1 = (**(code **)(in_RDI + 0xb8))
                        (*(undefined8 *)(lVar3 + 0x30),
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                         ,0x25d), iVar1 == 0)) {
    printf("%s:%u: failed assertion `%s\'\n",
           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
           ,0x25d,"CM_LOCKED(svc, sd->cm)");
    abort();
  }
  p_Var2->period_sec = in_EDX;
  p_Var2->period_usec = in_ECX;
  p_Var2->executing = 0xffffffffffffffff;
  gettimeofday((timeval *)&p_Var2->next_time,(__timezone_ptr_t)0x0);
  increment_time(&p_Var2->next_time,in_EDX,in_ECX);
  p_Var2->func = (select_list_func)in_R8;
  p_Var2->arg1 = in_R9;
  p_Var2->arg2 = sd;
  p_Var2->next = (periodic_task_handle)0x0;
  if (*(long *)(lVar3 + 0x20) == 0) {
    *(periodic_task_handle_conflict *)(lVar3 + 0x20) = p_Var2;
  }
  else {
    p_Var2->next = *(periodic_task_handle *)(lVar3 + 0x20);
    *(periodic_task_handle_conflict *)(lVar3 + 0x20) = p_Var2;
  }
  wake_server_thread((select_data_ptr)0x101d63);
  return p_Var2;
}

Assistant:

extern periodic_task_handle
libcmepoll_LTX_add_periodic(CMtrans_services svc, select_data_ptr *sdp, int interval_sec, int interval_usec, select_list_func func, void *arg1, void *arg2)
{
    select_data_ptr sd = *((select_data_ptr *)sdp);
    periodic_task_handle handle = malloc(sizeof(struct _periodic_task));
    if (sd == NULL) {
	init_select_data(svc, (select_data_ptr*)sdp, (CManager)NULL);
	sd = *((select_data_ptr *)sdp);
    }

    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    handle->period_sec = interval_sec;
    handle->period_usec = interval_usec;
    handle->executing = (thr_thread_t) -1;
#ifndef HAVE_WINDOWS_H
    gettimeofday(&handle->next_time, NULL);
#else
	/* GSE...  No gettimeofday on windows.  
	 * Must use _ftime, get millisec time, convert to usec.  Bleh.
	 */
    {
	struct _timeb nowb;
	_ftime(&nowb);
	handle->next_time.tv_sec = nowb.time;
	handle->next_time.tv_usec = nowb.millitm * 1000;
    }
#endif
    increment_time(&handle->next_time, interval_sec, interval_usec);
    handle->func = func;
    handle->arg1 = arg1;
    handle->arg2 = arg2;
    handle->next = NULL;

    if (sd->periodic_task_list == NULL) {
	sd->periodic_task_list = handle;
    } else {
	handle->next = sd->periodic_task_list;
	sd->periodic_task_list = handle;
    }
    wake_server_thread(sd);
    return handle;
}